

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licensecc.cpp
# Opt level: O2

void mergeLicenses(vector<LicenseInfo,_std::allocator<LicenseInfo>_> *licenses,
                  LicenseInfo *license_out)

{
  uint uVar1;
  pointer __src;
  
  if (license_out != (LicenseInfo *)0x0) {
    uVar1 = 0x80000000;
    for (__src = (licenses->super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __src != (licenses->super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>)._M_impl.
                 super__Vector_impl_data._M_finish; __src = __src + 1) {
      if (__src->has_expiry == false) {
        memcpy(license_out,__src,0x1958);
        return;
      }
      if ((int)uVar1 < (int)__src->days_left) {
        memcpy(license_out,__src,0x1958);
        uVar1 = __src->days_left;
      }
    }
  }
  return;
}

Assistant:

static void mergeLicenses(const vector<LicenseInfo>& licenses, LicenseInfo* license_out) {
	if (license_out != nullptr) {
		int days_left = INT_MIN;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			// choose the license that expires later...
			if (!it->has_expiry) {
				*license_out = *it;
				break;
			} else if (days_left < (int)it->days_left) {
				*license_out = *it;
				days_left = it->days_left;
			}
		}
	}
}